

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void pbrt::ParseString(SceneRepresentation *scene,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  paVar1 = &str->field_2;
  local_58._0_8_ = (str->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar1) {
    local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48._8_8_ = *(undefined8 *)((long)&str->field_2 + 8);
    local_58._0_8_ = &local_48;
  }
  else {
    local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58._8_8_ = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  local_38._M_unused._M_object = (_Invoker_type)0x0;
  local_38._8_8_ = (void *)0x0;
  local_20 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:889:21)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:889:21)>
             ::_M_manager;
  Tokenizer::CreateFromString
            ((Tokenizer *)local_68,(string *)local_58,
             (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  uVar2 = local_68._0_8_;
  if ((Tokenizer *)local_68._0_8_ != (Tokenizer *)0x0) {
    local_68._0_8_ = (_Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>)0x0
    ;
    local_68._8_8_ = uVar2;
    parse(scene,(unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)(local_68 + 8)
         );
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)(local_68 + 8))
    ;
  }
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
            ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_68);
  return;
}

Assistant:

void ParseString(SceneRepresentation *scene, std::string str) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };
    std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromString(std::move(str), tokError);
    if (!t)
        return;
    parse(scene, std::move(t));
}